

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFSystemError.hh
# Opt level: O2

void __thiscall QPDFSystemError::~QPDFSystemError(QPDFSystemError *this)

{
  *(undefined ***)this = &PTR__QPDFSystemError_002b0128;
  std::__cxx11::string::~string((string *)&this->description);
  std::runtime_error::~runtime_error(&this->super_runtime_error);
  return;
}

Assistant:

~QPDFSystemError() noexcept override = default;